

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O3

Llb_Mtr_t * Llb_MtrAlloc(int nPis,int nFfs,int nCols,int nRows)

{
  Llb_Mtr_t *pLVar1;
  int *piVar2;
  Llb_Grp_t **ppLVar3;
  char **ppcVar4;
  char *pcVar5;
  size_t __nmemb;
  ulong uVar6;
  size_t __nmemb_00;
  
  pLVar1 = (Llb_Mtr_t *)calloc(1,0x48);
  pLVar1->nPis = nPis;
  pLVar1->nFfs = nFfs;
  pLVar1->nRows = nRows;
  pLVar1->nCols = nCols;
  __nmemb_00 = (size_t)nRows;
  piVar2 = (int *)calloc(__nmemb_00,4);
  pLVar1->pRowSums = piVar2;
  __nmemb = (size_t)nCols;
  piVar2 = (int *)calloc(__nmemb,4);
  pLVar1->pColSums = piVar2;
  ppLVar3 = (Llb_Grp_t **)calloc(__nmemb,8);
  pLVar1->pColGrps = ppLVar3;
  ppcVar4 = (char **)calloc(__nmemb,8);
  pLVar1->pMatrix = ppcVar4;
  if (0 < nCols) {
    uVar6 = 0;
    do {
      pcVar5 = (char *)calloc(__nmemb_00,1);
      ppcVar4[uVar6] = pcVar5;
      uVar6 = uVar6 + 1;
    } while ((uint)nCols != uVar6);
  }
  pcVar5 = (char *)calloc(__nmemb_00,1);
  pLVar1->pProdVars = pcVar5;
  piVar2 = (int *)calloc(__nmemb_00,4);
  pLVar1->pProdNums = piVar2;
  return pLVar1;
}

Assistant:

Llb_Mtr_t * Llb_MtrAlloc( int nPis, int nFfs, int nCols, int nRows )
{
    Llb_Mtr_t * p;
    int i;
    p = ABC_CALLOC( Llb_Mtr_t, 1 );
    p->nPis  = nPis;
    p->nFfs  = nFfs;
    p->nRows = nRows;
    p->nCols = nCols;
    p->pRowSums = ABC_CALLOC( int, nRows );
    p->pColSums = ABC_CALLOC( int, nCols );
    p->pColGrps = ABC_CALLOC( Llb_Grp_t *, nCols );
    p->pMatrix  = ABC_CALLOC( char *, nCols );
    for ( i = 0; i < nCols; i++ )
        p->pMatrix[i] = ABC_CALLOC( char, nRows );
    // partial product
    p->pProdVars = ABC_CALLOC( char, nRows );  // variables in the partial product
    p->pProdNums = ABC_CALLOC( int, nRows );   // var counts in the remaining partitions
    return p;
}